

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_BREAKC(Context *ctx)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar1 = ctx->source_args[0].swizzle;
  uVar2 = uVar1 & 3;
  pcVar3 = "BREAKC src1 must have replicate swizzle";
  if (((uVar2 == (uVar1 >> 2 & 3)) && (uVar2 == (uVar1 >> 4 & 3))) && (uVar2 == (uVar1 >> 6 & 3))) {
    uVar1 = ctx->source_args[1].swizzle;
    uVar2 = uVar1 & 3;
    pcVar3 = "BREAKC src2 must have replicate swizzle";
    if (((uVar2 == (uVar1 >> 2 & 3)) && (uVar2 == (uVar1 >> 4 & 3))) && (uVar2 == (uVar1 >> 6 & 3)))
    {
      if ((ctx->loops != 0) || (ctx->reps != 0)) {
        return;
      }
      pcVar3 = "BREAKC outside LOOP/ENDLOOP or REP/ENDREP";
    }
  }
  failf(ctx,"%s",pcVar3);
  return;
}

Assistant:

static void state_BREAKC(Context *ctx)
{
    if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "BREAKC src1 must have replicate swizzle");
    else if (!replicate_swizzle(ctx->source_args[1].swizzle))
        fail(ctx, "BREAKC src2 must have replicate swizzle");
    else if ((ctx->loops == 0) && (ctx->reps == 0))
        fail(ctx, "BREAKC outside LOOP/ENDLOOP or REP/ENDREP");
}